

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall
CVmObjGramProd::load_alts(CVmObjGramProd *this,vm_obj_id_t self,CVmStream *src,CVmObjFixup *fixups)

{
  uchar uVar1;
  vm_prop_id_t vVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  uint uVar7;
  uint uVar8;
  vm_obj_id_t vVar9;
  vm_gram_ext *pvVar10;
  ulong uVar11;
  long in_RCX;
  vmgram_tok_info *this_00;
  long *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjFixup *in_RDI;
  size_t len;
  size_t k;
  size_t propcnt;
  size_t j;
  vmgram_tok_info *tok;
  vmgram_alt_info *alt;
  uint tokcnt;
  vm_obj_id_t proc_obj;
  int badness;
  int score;
  size_t i;
  size_t alt_cnt;
  size_t in_stack_ffffffffffffff58;
  vmgram_alt_info *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  ulong uVar12;
  CVmObjGramProd *in_stack_ffffffffffffff90;
  ulong local_68;
  vmgram_tok_info *local_60;
  vmgram_alt_info *in_stack_ffffffffffffffb8;
  vmgram_alt_info *pvVar13;
  ulong local_30;
  
  clear_alts((CVmObjGramProd *)in_stack_ffffffffffffff70);
  pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
  pvVar10->field_0x14 = pvVar10->field_0x14 & 0xfb;
  uVar3 = (**(code **)(*in_RDX + 0x30))();
  ensure_alts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  for (local_30 = 0; vVar9 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
      local_30 < uVar3; local_30 = local_30 + 1) {
    iVar4 = (**(code **)(*in_RDX + 0x28))();
    iVar5 = (**(code **)(*in_RDX + 0x28))();
    vVar6 = (**(code **)(*in_RDX + 0x40))();
    uVar7 = (**(code **)(*in_RDX + 0x30))();
    if (in_RCX != 0) {
      vVar6 = CVmObjFixup::get_new_id(in_RDI,vVar9);
    }
    in_stack_ffffffffffffff70 = (vmgram_alt_info *)operator_new(0x20);
    vmgram_alt_info::vmgram_alt_info
              ((vmgram_alt_info *)CONCAT44(vVar6,uVar7),(size_t)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffff70->score = iVar4;
    in_stack_ffffffffffffff70->badness = iVar5;
    in_stack_ffffffffffffff70->proc_obj = vVar6;
    pvVar13 = in_stack_ffffffffffffff70;
    pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
    pvVar10->alt_cnt_ = pvVar10->alt_cnt_ + 1;
    in_stack_ffffffffffffffb8 = pvVar13;
    pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
    pvVar10->alts_[local_30] = pvVar13;
    local_60 = in_stack_ffffffffffffffb8->toks;
    for (local_68 = 0; local_68 < uVar7; local_68 = local_68 + 1) {
      vVar2 = (**(code **)(*in_RDX + 0x30))();
      local_60->prop = vVar2;
      uVar1 = (**(code **)(*in_RDX + 0x18))();
      local_60->typ = uVar1;
      this_00 = (vmgram_tok_info *)(ulong)(local_60->typ - 1);
      switch(this_00) {
      case (vmgram_tok_info *)0x0:
        vVar9 = (**(code **)(*in_RDX + 0x40))();
        (local_60->typinfo).prod_obj = vVar9;
        if (in_RCX != 0) {
          vVar9 = CVmObjFixup::get_new_id
                            (in_RDI,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
          (local_60->typinfo).prod_obj = vVar9;
        }
        break;
      case (vmgram_tok_info *)0x1:
        vVar2 = (**(code **)(*in_RDX + 0x30))();
        (local_60->typinfo).speech_prop = vVar2;
        break;
      case (vmgram_tok_info *)0x2:
        uVar8 = (**(code **)(*in_RDX + 0x30))();
        uVar11 = (ulong)uVar8;
        vmgram_tok_info::set_literal(this_00,in_stack_ffffffffffffff58);
        (**(code **)(*in_RDX + 0x70))(in_RDX,(local_60->typinfo).nspeech.cnt,uVar11);
        break;
      case (vmgram_tok_info *)0x3:
        vVar9 = (**(code **)(*in_RDX + 0x40))();
        (local_60->typinfo).prod_obj = vVar9;
        break;
      case (vmgram_tok_info *)0x4:
        break;
      case (vmgram_tok_info *)0x5:
        uVar8 = (**(code **)(*in_RDX + 0x30))();
        uVar11 = (ulong)uVar8;
        vmgram_tok_info::set_nspeech(this_00,in_stack_ffffffffffffff58);
        for (uVar12 = 0; uVar12 < uVar11; uVar12 = uVar12 + 1) {
          vVar2 = (**(code **)(*in_RDX + 0x30))();
          (local_60->typinfo).nspeech.props[uVar12] = vVar2;
        }
      }
      local_60 = local_60 + 1;
    }
    if (((uVar7 != 0) && (in_stack_ffffffffffffffb8->toks->typ == '\x01')) &&
       ((in_stack_ffffffffffffffb8->toks->typinfo).prod_obj == in_ESI)) {
      pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
      pvVar10->field_0x14 = pvVar10->field_0x14 & 0xfb | 4;
    }
  }
  return;
}

Assistant:

void CVmObjGramProd::load_alts(VMG_ vm_obj_id_t self,
                               CVmStream *src, CVmObjFixup *fixups)
{
    /* delete any existing alternative list */
    clear_alts();

    /* presume there will be no circular alternatives */
    get_ext()->has_circular_alt = FALSE;

    /* read the number of alternatives */
    size_t alt_cnt = src->read_uint2();

    /* ensure there's room for the new list */
    ensure_alts(alt_cnt, 0);

    /* load the alternatives */
    for (size_t i = 0 ; i < alt_cnt ; ++i)
    {
        /* read the alternative header */
        int score = src->read_int2();
        int badness = src->read_int2();
        vm_obj_id_t proc_obj = (vm_obj_id_t)src->read_uint4();
        uint tokcnt = src->read_uint2();

        /* fix up the processor object ID */
        if (fixups != 0)
            proc_obj = fixups->get_new_id(vmg_ proc_obj);

        /* create this alternative */
        vmgram_alt_info *alt = new vmgram_alt_info(tokcnt);
        alt->score = score;
        alt->badness = badness;
        alt->proc_obj = proc_obj;

        /* add it to the list in our extension */
        get_ext()->alt_cnt_ += 1;
        get_ext()->alts_[i] = alt;

        /* get the first token */
        vmgram_tok_info *tok = alt->toks;

        /* read the tokens */
        for (size_t j = 0 ; j < tokcnt ; ++j, ++tok)
        {
            /* read the fixed part of the token */
            tok->prop = (vm_prop_id_t)src->read_uint2();
            tok->typ = (vmgram_match_type)src->read_byte();

            /* read the extra data according to the token type */
            switch (tok->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* read the object ID */
                tok->typinfo.prod_obj = (vm_obj_id_t)src->read_uint4();

                /* fix it up if necessary */
                if (fixups != 0)
                    tok->typinfo.prod_obj = fixups->get_new_id(
                        vmg_ tok->typinfo.prod_obj);
                break;

            case VMGRAM_MATCH_SPEECH:
                /* read the part-of-speech property */
                tok->typinfo.speech_prop = (vm_prop_id_t)src->read_uint2();
                break;

            case VMGRAM_MATCH_NSPEECH:
                /* array of part-of-speech properties */
                {
                    /* read the count */
                    size_t propcnt = src->read_uint2();

                    /* allocate the array */
                    tok->set_nspeech(propcnt);

                    /* read the properties */
                    for (size_t k = 0 ; k < propcnt ; ++k)
                    {
                        tok->typinfo.nspeech.props[k] =
                            (vm_prop_id_t)src->read_uint2();
                    }
                }
                break;

            case VMGRAM_MATCH_LITERAL:
                /* literal string */
                {
                    /* read the length */
                    size_t len = src->read_uint2();

                    /* allocate the string */
                    tok->set_literal(len);

                    /* read the string */
                    src->read_bytes(tok->typinfo.lit.str, len);
                }
                break;

            case VMGRAM_MATCH_TOKTYPE:
                /* token type */
                tok->typinfo.toktyp_enum = src->read_uint4();
                break;

            case VMGRAM_MATCH_STAR:
                /* star - no additional data */
                break;
            }
        }
        
        /* 
         *   If the first token of the alternative is a recursive reference
         *   to this production itself, we have a circular reference.  Note
         *   this, since we have to handle it specially when parsing. 
         */
        tok = alt->toks;
        if (tokcnt != 0
            && tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj == self)
        {
            /* note the existence of a circular reference */
            get_ext()->has_circular_alt = TRUE;
        }
    }
}